

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O3

int funchook_unprotect_end(funchook_t *funchook,mem_state_t *mstate)

{
  void *pvVar1;
  size_t sVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char errbuf [128];
  char acStack_a8 [136];
  
  iVar3 = mprotect(mstate->addr,mstate->size,5);
  pvVar1 = mstate->addr;
  sVar2 = mstate->size;
  if (iVar3 == 0) {
    iVar3 = 0;
    funchook_log(funchook,"  protect memory %p (size=%lu, prot=read,exec)\n",pvVar1,sVar2);
  }
  else {
    piVar4 = __errno_location();
    pcVar5 = strerror_r(*piVar4,acStack_a8,0x80);
    funchook_set_error_message
              (funchook,"Failed to protect memory %p (size=%lu, prot=read,exec, error=%s)",pvVar1,
               sVar2,pcVar5);
    iVar3 = 9;
  }
  return iVar3;
}

Assistant:

int funchook_unprotect_end(funchook_t *funchook, const mem_state_t *mstate)
{
    char errbuf[128];
    int rv = mprotect(mstate->addr, mstate->size, PROT_READ | PROT_EXEC);

    if (rv == 0) {
        funchook_log(funchook, "  protect memory %p (size=%"PRIuPTR", prot=read,exec)\n",
                     mstate->addr, mstate->size);
        return 0;
    }
    funchook_set_error_message(funchook, "Failed to protect memory %p (size=%"PRIuPTR", prot=read,exec, error=%s)",
                               mstate->addr, mstate->size,
                               funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_FUNCTION;
}